

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-cdf-cursor.c
# Opt level: O3

int coda_cdf_cursor_goto_array_element_by_index(coda_cursor_conflict *cursor,long index)

{
  coda_type *pcVar1;
  long lVar2;
  coda_dynamic_type_struct *pcVar3;
  int iVar4;
  long lVar5;
  long in_FS_OFFSET;
  
  if (*(int *)(in_FS_OFFSET + -0x1208) == 0) {
    lVar5 = (long)cursor->n;
  }
  else {
    lVar5 = (long)cursor->n;
    pcVar1 = (cursor->stack[lVar5 + -1].type)->definition;
    lVar2._0_4_ = pcVar1[1].type_class;
    lVar2._4_4_ = pcVar1[1].read_type;
    if ((index < 0) || (lVar2 <= index)) {
      coda_set_error(-0x6b,"array index (%ld) exceeds array range [0:%ld)");
      return -1;
    }
  }
  pcVar3 = *(coda_dynamic_type_struct **)(cursor->stack[lVar5 + -1].type + 2);
  iVar4 = (int)lVar5;
  cursor->n = iVar4 + 1;
  cursor->stack[iVar4].type = pcVar3;
  cursor->stack[iVar4].index = index;
  cursor->stack[iVar4].bit_offset = -1;
  return 0;
}

Assistant:

int coda_cdf_cursor_goto_array_element_by_index(coda_cursor *cursor, long index)
{
    coda_dynamic_type *base_type;

    /* check the range for index */
    if (coda_option_perform_boundary_checks)
    {
        long num_elements;

        num_elements = ((coda_type_array *)cursor->stack[cursor->n - 1].type->definition)->num_elements;
        if (index < 0 || index >= num_elements)
        {
            coda_set_error(CODA_ERROR_ARRAY_OUT_OF_BOUNDS, "array index (%ld) exceeds array range [0:%ld)", index,
                           num_elements);
            return -1;
        }
    }

    base_type = (coda_dynamic_type *)((coda_cdf_variable *)cursor->stack[cursor->n - 1].type)->base_type;

    cursor->n++;
    cursor->stack[cursor->n - 1].type = base_type;
    cursor->stack[cursor->n - 1].index = index;
    cursor->stack[cursor->n - 1].bit_offset = -1;       /* not applicable for netCDF backend */

    return 0;
}